

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.h
# Opt level: O0

Index __thiscall wabt::BindingHash::FindIndex(BindingHash *this,string_view name)

{
  Index IVar1;
  string local_40;
  BindingHash *local_20;
  BindingHash *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (BindingHash *)name.data_;
  local_20 = this;
  string_view::to_string_abi_cxx11_(&local_40,(string_view *)&this_local);
  IVar1 = FindIndex(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return IVar1;
}

Assistant:

Index FindIndex(string_view name) const {
    return FindIndex(name.to_string());
  }